

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType1Tracer.cpp
# Opt level: O2

Type1CharString * __thiscall
CharStringType1Tracer::GetSubr(CharStringType1Tracer *this,long inSubrIndex)

{
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"callsubr",&local_39);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  iVar1 = (*(this->mHelper->super_Type1InterpreterImplementationAdapter).
            super_IType1InterpreterImplementation._vptr_IType1InterpreterImplementation[8])
                    (this->mHelper,inSubrIndex);
  return (Type1CharString *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Type1CharString* CharStringType1Tracer::GetSubr(long inSubrIndex)
{
	mPrimitiveWriter.WriteKeyword("callsubr");
	return mHelper->GetSubr(inSubrIndex);
}